

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char *z;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  sqlite3_vfs *psVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  char *z_00;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  sqlite3_uint64 n;
  int *piVar17;
  OpenMode *pOVar18;
  uint local_6c;
  uint local_60;
  uint local_5c;
  char *local_50;
  
  local_6c = *pFlags;
  uVar4 = sqlite3Strlen30(zUri);
  uVar13 = (ulong)uVar4;
  if ((local_6c & 0x40) == 0) {
    if (sqlite3Config.bOpenUri == '\0' || uVar4 < 5) goto LAB_0018a072;
LAB_0018a058:
    iVar5 = bcmp(zUri,"file:",5);
    if (iVar5 != 0) goto LAB_0018a072;
    n = (sqlite3_uint64)(uVar4 + 8);
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      n = n + (zUri[uVar9] == '&');
    }
    puVar6 = (undefined4 *)sqlite3_malloc64(n);
    if (puVar6 == (undefined4 *)0x0) {
      return 7;
    }
    local_6c = local_6c | 0x40;
    *puVar6 = 0;
    z_00 = (char *)(puVar6 + 1);
    uVar13 = 5;
    if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_0018a1c2:
      iVar5 = 0;
      iVar14 = 0;
      do {
        lVar12 = (long)iVar14;
        uVar13 = uVar13 & 0xffffffff;
LAB_0018a1df:
        uVar4 = (uint)uVar13;
        bVar16 = zUri[(int)uVar4];
        if ((bVar16 == 0) || (bVar16 == 0x23)) {
          if (iVar5 == 1) {
            z_00[lVar12] = '\0';
            lVar12 = (long)(iVar14 + 1);
          }
          pcVar8 = z_00 + lVar12;
          pcVar8[0] = '\0';
          pcVar8[1] = '\0';
          pcVar8[2] = '\0';
          pcVar8[3] = '\0';
          uVar4 = sqlite3Strlen30(z_00);
          pcVar8 = z_00;
          local_50 = zDefaultVfs;
          goto LAB_0018a378;
        }
        uVar15 = uVar4 + 1;
        uVar13 = (ulong)uVar15;
        if (((bVar16 == 0x25) && (bVar1 = zUri[(int)uVar15], (""[bVar1] & 8) != 0)) &&
           (bVar2 = zUri[(long)(int)uVar4 + 2], (""[bVar2] & 8) != 0)) {
          uVar13 = (ulong)(uVar4 + 3);
          bVar16 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
                   (((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1) * '\x10';
          if (bVar16 != 0) goto LAB_0018a30d;
          for (pcVar8 = zUri + (int)(uVar4 + 3);
              ((cVar3 = *pcVar8, cVar3 != '\0' && (cVar3 != '#')) &&
              ((iVar5 != 0 || (cVar3 != '?')))); pcVar8 = pcVar8 + 1) {
            if (iVar5 == 1) {
              if ((cVar3 == '&') || (cVar3 == '=')) break;
            }
            else if ((iVar5 == 2) && (cVar3 == '&')) break;
            uVar13 = (ulong)((int)uVar13 + 1);
          }
          goto LAB_0018a1df;
        }
        iVar11 = 1;
        if (iVar5 != 1) {
          if (((iVar5 != 0) || (bVar16 != 0x3f)) && ((iVar5 != 2 || (bVar16 != 0x26))))
          goto LAB_0018a30d;
          goto LAB_0018a341;
        }
        if ((bVar16 != 0x3d) && (iVar5 = iVar11, bVar16 != 0x26)) goto LAB_0018a30d;
        if (*(char *)((long)puVar6 + lVar12 + 3) == '\0') {
          pcVar8 = zUri + (int)uVar15;
          while( true ) {
            uVar4 = uVar4 + 1;
            uVar13 = (ulong)uVar4;
            iVar5 = iVar11;
            if (((*pcVar8 == '\0') || (*pcVar8 == '#')) || (pcVar8[-1] == '&')) break;
            pcVar8 = pcVar8 + 1;
          }
          goto LAB_0018a1df;
        }
        if (bVar16 != 0x26) {
          bVar16 = 0;
          iVar5 = 2;
          goto LAB_0018a30d;
        }
        iVar14 = iVar14 + 1;
        z_00[lVar12] = '\0';
        lVar12 = (long)iVar14;
LAB_0018a341:
        bVar16 = 0;
        iVar5 = iVar11;
LAB_0018a30d:
        iVar14 = iVar14 + 1;
        z_00[lVar12] = bVar16;
      } while( true );
    }
    for (uVar9 = 0; (zUri[uVar9 + 7] != '\0' && (zUri[uVar9 + 7] != '/')); uVar9 = uVar9 + 1) {
    }
    uVar13 = uVar9 + 7;
    if ((int)uVar13 == 0x10) {
      iVar5 = bcmp("localhost",zUri + 7,9);
      if (iVar5 == 0) {
        uVar13 = 0x10;
        goto LAB_0018a1c2;
      }
    }
    else if ((int)uVar13 == 7) goto LAB_0018a1c2;
    pcVar8 = sqlite3_mprintf("invalid uri authority: %.*s",uVar9 & 0xffffffff,zUri + 7);
  }
  else {
    if (4 < uVar4) goto LAB_0018a058;
LAB_0018a072:
    puVar6 = (undefined4 *)sqlite3_malloc64((ulong)(uVar4 + 8));
    if (puVar6 == (undefined4 *)0x0) {
      return 7;
    }
    *puVar6 = 0;
    z_00 = (char *)(puVar6 + 1);
    if (uVar4 == 0) {
      uVar13 = 0;
    }
    else {
      memcpy(z_00,zUri,uVar13);
    }
    pcVar8 = z_00 + uVar13;
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    local_6c = local_6c & 0xffffffbf;
LAB_0018a0b9:
    psVar7 = sqlite3_vfs_find(zDefaultVfs);
    *ppVfs = psVar7;
    iVar5 = 0;
    if (psVar7 != (sqlite3_vfs *)0x0) goto LAB_0018a0f4;
    pcVar8 = sqlite3_mprintf("no such vfs: %s",zDefaultVfs);
  }
  iVar5 = 1;
LAB_0018a0e2:
  *pzErrMsg = pcVar8;
  sqlite3_free_filename(z_00);
  z_00 = (char *)0x0;
LAB_0018a0f4:
  *pFlags = local_6c;
  *pzFile = z_00;
  return iVar5;
LAB_0018a378:
  zDefaultVfs = local_50;
  if (pcVar8[(ulong)uVar4 + 1] != '\0') {
    piVar17 = (int *)(pcVar8 + (ulong)uVar4 + 1);
    uVar15 = sqlite3Strlen30((char *)piVar17);
    pcVar8 = (char *)((long)piVar17 + (ulong)uVar15 + 1);
    uVar4 = sqlite3Strlen30(pcVar8);
    if (uVar15 == 5) goto LAB_0018a407;
    if (uVar15 == 4) {
      if (*piVar17 == 0x65646f6d) {
        local_5c = local_6c & 0x87;
        local_60 = 0xffffff78;
        pOVar18 = sqlite3ParseUri::aOpenMode;
        pcVar10 = "access";
        goto LAB_0018a43f;
      }
    }
    else if ((uVar15 == 3) && (iVar5 = bcmp("vfs",piVar17,3), iVar5 == 0)) {
      local_50 = pcVar8;
    }
    goto LAB_0018a378;
  }
  goto LAB_0018a0b9;
LAB_0018a407:
  iVar5 = bcmp("cache",piVar17,5);
  if (iVar5 == 0) {
    local_5c = 0x60000;
    local_60 = 0xfff9ffff;
    pOVar18 = sqlite3ParseUri::aCacheMode;
    pcVar10 = "cache";
LAB_0018a43f:
    piVar17 = &pOVar18->mode;
    while( true ) {
      z = ((OpenMode *)(piVar17 + -2))->z;
      if (z == (char *)0x0) goto LAB_0018a4ba;
      uVar15 = sqlite3Strlen30(z);
      if ((uVar4 == uVar15) && (iVar5 = bcmp(pcVar8,z,(ulong)uVar4), iVar5 == 0)) break;
      piVar17 = piVar17 + 4;
    }
    uVar15 = *piVar17;
    if (uVar15 == 0) {
LAB_0018a4ba:
      pcVar8 = sqlite3_mprintf("no such %s mode: %s",pcVar10,pcVar8);
      iVar5 = 1;
      goto LAB_0018a0e2;
    }
    if ((int)local_5c < (int)(uVar15 & 0xffffff7f)) {
      pcVar8 = sqlite3_mprintf("%s mode not allowed: %s",pcVar10,pcVar8);
      iVar5 = 3;
      goto LAB_0018a0e2;
    }
    local_6c = uVar15 | local_60 & local_6c;
  }
  goto LAB_0018a378;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)                     /* IMP: R-48725-32206 */
       || AtomicLoad(&sqlite3GlobalConfig.bOpenUri)) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0         /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+8;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    memset(zFile, 0, 4);  /* 4-byte of 0x00 is the start of DB name marker */
    zFile += 4;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s",
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer.
    ** Decode %HH escape codes along the way.
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%'
       && sqlite3Isxdigit(zUri[iIn])
       && sqlite3Isxdigit(zUri[iIn+1])
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#'
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    memset(zFile+iOut, 0, 4); /* end-of-options + empty journal filenames */

    /* Check if there were any options specified that should be interpreted
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE },
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+8);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    memset(zFile, 0, 4);
    zFile += 4;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    memset(zFile+nUri, 0, 4);
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free_filename(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}